

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  cmExpandedCommandArgument *this_00;
  bool bVar1;
  char *pcVar2;
  double dVar3;
  char *def;
  double d;
  char *end;
  string local_78;
  allocator local_41;
  string local_40;
  cmExpandedCommandArgument *local_20;
  cmExpandedCommandArgument *arg_local;
  cmConditionEvaluator *this_local;
  
  local_20 = arg;
  arg_local = (cmExpandedCommandArgument *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"0",&local_41);
  bVar1 = cmExpandedCommandArgument::operator==(arg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = local_20;
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"1",(allocator *)((long)&end + 7));
    bVar1 = cmExpandedCommandArgument::operator==(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&end + 7));
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pcVar2 = cmExpandedCommandArgument::c_str(local_20);
      bVar1 = cmSystemTools::IsOn(pcVar2);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pcVar2 = cmExpandedCommandArgument::c_str(local_20);
        bVar1 = cmSystemTools::IsOff(pcVar2);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = cmExpandedCommandArgument::empty(local_20);
          if (!bVar1) {
            pcVar2 = cmExpandedCommandArgument::c_str(local_20);
            dVar3 = strtod(pcVar2,(char **)&d);
            if (*(char *)d == '\0') {
              return dVar3 != 0.0;
            }
          }
          pcVar2 = GetDefinitionIfUnquoted(this,local_20);
          bVar1 = cmSystemTools::IsOff(pcVar2);
          this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic constants.
  if (arg == "0") {
    return false;
  }
  if (arg == "1") {
    return true;
  }

  // Check named constants.
  if (cmSystemTools::IsOn(arg.c_str())) {
    return true;
  }
  if (cmSystemTools::IsOff(arg.c_str())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    double d = strtod(arg.c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  return !cmSystemTools::IsOff(def);
}